

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O2

int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,double roll,double pitch)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  char buf [32];
  
  sprintf(buf,"#EI%+06d\r",(ulong)(uint)(int)(roll * 100.0));
  sVar3 = strlen(buf);
  iVar2 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)buf,(int)sVar3);
  if (iVar2 == 0) {
    if ((pPathfinderDVL->bSaveRawData != 0) &&
       (pFVar1 = (FILE *)pPathfinderDVL->pfSaveFile, pFVar1 != (FILE *)0x0)) {
      sVar3 = strlen(buf);
      fwrite(buf,sVar3,1,pFVar1);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    sprintf(buf,"#EJ%+06d\r",(ulong)(uint)(int)(pitch * 100.0));
    sVar3 = strlen(buf);
    iVar2 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)buf,(int)sVar3);
    if (iVar2 == 0) {
      if (pPathfinderDVL->bSaveRawData == 0) {
        return 0;
      }
      pFVar1 = (FILE *)pPathfinderDVL->pfSaveFile;
      if (pFVar1 == (FILE *)0x0) {
        return 0;
      }
      sVar3 = strlen(buf);
      fwrite(buf,sVar3,1,pFVar1);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
      return 0;
    }
  }
  puts("Error writing data to a PathfinderDVL. ");
  return 1;
}

Assistant:

inline int SetRollPitchMisalignmentPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, double roll, double pitch)
{
	char buf[MAX_NB_BYTES_COMMAND_PATHFINDERDVL];
	
	sprintf(buf, "#EI%+06d\r", (int)(100*roll));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}
	
	sprintf(buf, "#EJ%+06d\r", (int)(100*pitch));

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}